

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O3

bool tinyusdz::is_valid_utf8_identifier(string *str)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> codepoints;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  to_codepoints(&local_30,str);
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_002a461b:
    bVar5 = false;
  }
  else {
    uVar1 = *local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar1 != 0x5f) {
      if (0x10ffff < uVar1) {
LAB_002a45bd:
        bVar5 = false;
        goto LAB_002a4622;
      }
      uVar4 = (long)DAT_0045e360 - (long)unicode_xid::detail::kXID_StartTable >> 3;
      piVar3 = unicode_xid::detail::kXID_StartTable;
      while (piVar2 = piVar3, 0 < (long)uVar4) {
        uVar6 = uVar4 >> 1;
        uVar4 = ~uVar6 + uVar4;
        piVar3 = piVar2 + uVar6 * 2 + 2;
        if ((int)uVar1 <= piVar2[uVar6 * 2 + 1]) {
          uVar4 = uVar6;
          piVar3 = piVar2;
        }
      }
      if (((piVar2 == DAT_0045e360) || ((int)uVar1 < *piVar2)) || (piVar2[1] < (int)uVar1))
      goto LAB_002a461b;
    }
    uVar4 = (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    bVar5 = true;
    if (1 < uVar4) {
      uVar6 = 1;
      do {
        uVar1 = local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        if (uVar1 != 0x5f) {
          uVar8 = (long)DAT_0045e378 - (long)unicode_xid::detail::kXID_ContinueTable >> 3;
          piVar3 = unicode_xid::detail::kXID_ContinueTable;
          if (0x10ffff < uVar1) goto LAB_002a45bd;
          while (piVar2 = piVar3, 0 < (long)uVar8) {
            uVar7 = uVar8 >> 1;
            uVar8 = ~uVar7 + uVar8;
            piVar3 = piVar2 + uVar7 * 2 + 2;
            if ((int)uVar1 <= piVar2[uVar7 * 2 + 1]) {
              uVar8 = uVar7;
              piVar3 = piVar2;
            }
          }
          if (((piVar2 == DAT_0045e378) || ((int)uVar1 < *piVar2)) || (piVar2[1] < (int)uVar1))
          goto LAB_002a461b;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar4);
    }
  }
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start == (uint *)0x0) {
    return bVar5;
  }
LAB_002a4622:
  operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return bVar5;
}

Assistant:

bool is_valid_utf8_identifier(const std::string &str) {
  // First convert to codepoint values.
  std::vector<uint32_t> codepoints = to_codepoints(str);

  if (codepoints.empty()) {
    return false;
  }

  // (XID_Start|_) (XID_Continue|_)+
  
  if ((codepoints[0] != '_') && !unicode_xid::is_xid_start(codepoints[0])) {
    return false;
  }

  for (size_t i = 1; i < codepoints.size(); i++) {
    if ((codepoints[i] != '_') && !unicode_xid::is_xid_continue(codepoints[i])) {
      return false;
    }
  }

  return true; 
}